

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueRef *value)

{
  long lVar1;
  Type TVar2;
  int32 iVar3;
  uint32 uVar4;
  int iVar5;
  MessageLite *value_00;
  ulong uVar6;
  int64 value_01;
  size_t sVar7;
  string *psVar8;
  LogMessage *pLVar9;
  size_t sStack_50;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar2 = FieldDescriptor::type(field);
  switch(TVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sStack_50 = 8;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sStack_50 = 4;
    break;
  case TYPE_INT64:
    uVar6 = MapValueRef::GetInt64Value(value);
    goto LAB_0033641b;
  case TYPE_UINT64:
    uVar6 = MapValueRef::GetUInt64Value(value);
LAB_0033641b:
    lVar1 = 0x3f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar5 = (int)lVar1;
LAB_00336423:
    sStack_50 = (size_t)(iVar5 * 9 + 0x49U >> 6);
    break;
  case TYPE_INT32:
    iVar3 = MapValueRef::GetInt32Value(value);
    goto LAB_003364bf;
  case TYPE_BOOL:
    sStack_50 = 1;
    break;
  case TYPE_STRING:
    psVar8 = MapValueRef::GetStringValue_abi_cxx11_(value);
    sVar7 = WireFormatLite::StringSize(psVar8);
    return sVar7;
  case TYPE_GROUP:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x500);
    pLVar9 = LogMessage::operator<<(&local_40,"Unsupported");
    LogFinisher::operator=(&local_41,pLVar9);
    goto LAB_00336490;
  case TYPE_MESSAGE:
    value_00 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    sVar7 = WireFormatLite::MessageSize(value_00);
    return sVar7;
  case TYPE_BYTES:
    psVar8 = MapValueRef::GetStringValue_abi_cxx11_(value);
    sVar7 = WireFormatLite::BytesSize(psVar8);
    return sVar7;
  case TYPE_UINT32:
    uVar4 = MapValueRef::GetUInt32Value(value);
    iVar5 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    goto LAB_00336423;
  case TYPE_ENUM:
    iVar3 = MapValueRef::GetEnumValue(value);
LAB_003364bf:
    sVar7 = io::CodedOutputStream::VarintSize32SignExtended(iVar3);
    return sVar7;
  case TYPE_SINT32:
    iVar3 = MapValueRef::GetInt32Value(value);
    sVar7 = WireFormatLite::SInt32Size(iVar3);
    return sVar7;
  case MAX_TYPE:
    value_01 = MapValueRef::GetInt64Value(value);
    sVar7 = WireFormatLite::SInt64Size(value_01);
    return sVar7;
  default:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x520);
    pLVar9 = LogMessage::operator<<(&local_40,"Cannot get here");
    LogFinisher::operator=(&local_41,pLVar9);
LAB_00336490:
    LogMessage::~LogMessage(&local_40);
    sStack_50 = 0;
  }
  return sStack_50;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}